

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_evaluate_nurbs.cpp
# Opt level: O3

bool ON_EvaluateNurbsDeBoor
               (int cv_dim,int order,int cv_stride,double *cv,double *knots,int side,double mult_k,
               double t)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double *pdVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  long lVar11;
  double *pdVar12;
  ulong uVar13;
  long lVar14;
  double *pdVar15;
  double dVar16;
  double workarray [21];
  double *local_f8;
  double local_d8 [21];
  
  lVar14 = (long)order;
  dVar1 = knots[lVar14 + -2];
  dVar2 = knots[lVar14 + -1];
  if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_evaluate_nurbs.cpp"
               ,0x571,"","ON_EvaluateNurbsDeBoor(): knots[degree-1] == knots[degree]");
    goto LAB_0045e775;
  }
  iVar7 = cv_stride - cv_dim;
  uVar13 = lVar14 - 1;
  iVar3 = (int)uVar13;
  if (side < 0) {
    if (dVar2 == t) {
      if ((dVar2 == knots[(long)(iVar3 * 2) + -1]) &&
         (!NAN(dVar2) && !NAN(knots[(long)(iVar3 * 2) + -1]))) goto LAB_0045e775;
    }
    pdVar4 = knots + lVar14 + -2;
    if (side != -2) {
      if ((dVar1 != *knots) || (mult_k = dVar1, NAN(dVar1) || NAN(*knots))) {
        lVar11 = lVar14;
        if (order < 0x17) {
          if (iVar3 == 0) goto LAB_0045e775;
          pdVar9 = local_d8;
          local_f8 = (double *)0x0;
        }
        else {
          pdVar9 = (double *)onmalloc(uVar13 * 8);
          local_f8 = pdVar9;
        }
        do {
          *pdVar9 = t - knots[lVar11 + -2];
          pdVar9 = pdVar9 + 1;
          lVar11 = lVar11 + -1;
        } while ((int)lVar11 != 1);
        pdVar9 = pdVar9 + (1 - lVar14);
        lVar14 = (long)cv_stride;
        do {
          pdVar8 = pdVar4 + uVar13;
          uVar6 = uVar13 & 0xffffffff;
          pdVar15 = cv + order * cv_stride + -lVar14;
          pdVar10 = pdVar4;
          pdVar12 = cv + order * cv_stride;
          do {
            if (cv_dim == 0) {
              pdVar15 = pdVar15 + -(long)iVar7;
              pdVar12 = pdVar12 + -(long)iVar7;
            }
            else {
              dVar16 = *pdVar9 / (*pdVar8 - *pdVar10);
              pdVar12 = pdVar12 + -lVar14;
              pdVar15 = pdVar15 + -lVar14;
              iVar3 = cv_dim;
              do {
                pdVar12[(long)cv_dim + -1] =
                     pdVar15[(long)cv_dim + -1] * (1.0 - dVar16) +
                     pdVar12[(long)cv_dim + -1] * dVar16;
                pdVar12 = pdVar12 + -1;
                pdVar15 = pdVar15 + -1;
                iVar3 = iVar3 + -1;
              } while (iVar3 != 0);
              pdVar12 = pdVar12 + cv_dim;
              pdVar15 = pdVar15 + cv_dim;
            }
            uVar5 = (int)uVar6 - 1;
            uVar6 = (ulong)uVar5;
            pdVar9 = pdVar9 + 1;
            pdVar8 = pdVar8 + -1;
            pdVar10 = pdVar10 + -1;
          } while (uVar5 != 0);
          pdVar9 = pdVar9 + -uVar13;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
        goto LAB_0045eb5a;
      }
    }
    if (iVar3 != 0) {
      lVar14 = (long)cv_stride;
      do {
        pdVar9 = pdVar4 + uVar13;
        uVar6 = uVar13 & 0xffffffff;
        pdVar15 = cv + order * cv_stride;
        pdVar8 = cv + order * cv_stride + -lVar14;
        do {
          if (cv_dim == 0) {
            pdVar8 = pdVar8 + -(long)iVar7;
            pdVar15 = pdVar15 + -(long)iVar7;
          }
          else {
            dVar16 = (t - mult_k) / (*pdVar9 - mult_k);
            pdVar15 = pdVar15 + -lVar14;
            pdVar8 = pdVar8 + -lVar14;
            iVar3 = cv_dim;
            do {
              pdVar15[(long)cv_dim + -1] =
                   pdVar8[(long)cv_dim + -1] * (1.0 - dVar16) + pdVar15[(long)cv_dim + -1] * dVar16;
              pdVar15 = pdVar15 + -1;
              pdVar8 = pdVar8 + -1;
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
            pdVar15 = pdVar15 + cv_dim;
            pdVar8 = pdVar8 + cv_dim;
          }
          uVar5 = (int)uVar6 - 1;
          uVar6 = (ulong)uVar5;
          pdVar9 = pdVar9 + -1;
        } while (uVar5 != 0);
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
  }
  else {
    if (dVar1 == t) {
      if ((dVar1 == *knots) && (!NAN(dVar1) && !NAN(*knots))) goto LAB_0045e775;
    }
    pdVar4 = knots + lVar14 + -1;
    if (side != 2) {
      if ((dVar2 != knots[(long)(iVar3 * 2) + -1]) ||
         (mult_k = dVar2, NAN(dVar2) || NAN(knots[(long)(iVar3 * 2) + -1]))) {
        if (order < 0x17) {
          if (iVar3 == 0) goto LAB_0045e775;
          pdVar9 = local_d8;
          local_f8 = (double *)0x0;
        }
        else {
          pdVar9 = (double *)onmalloc(uVar13 * 8);
          local_f8 = pdVar9;
        }
        lVar14 = lVar14 * 8 + -8;
        lVar11 = 0;
        do {
          pdVar9[lVar11] = pdVar4[lVar11] - t;
          lVar11 = lVar11 + 1;
          lVar14 = lVar14 + -8;
        } while (iVar3 != (int)lVar11);
        pdVar9 = (double *)((long)pdVar9 - lVar14);
        do {
          pdVar10 = pdVar4 + -uVar13;
          uVar6 = uVar13 & 0xffffffff;
          pdVar12 = pdVar4;
          pdVar15 = cv + cv_stride;
          pdVar8 = cv;
          do {
            if (cv_dim != 0) {
              dVar16 = *pdVar9 / (*pdVar12 - *pdVar10);
              lVar11 = 0;
              lVar14 = 0;
              do {
                pdVar8[lVar14] = pdVar8[lVar14] * dVar16 + pdVar15[lVar14] * (1.0 - dVar16);
                lVar14 = lVar14 + 1;
                lVar11 = lVar11 + -8;
              } while (cv_dim != (int)lVar14);
              pdVar15 = (double *)((long)pdVar15 - lVar11);
              pdVar8 = (double *)((long)pdVar8 - lVar11);
            }
            uVar5 = (int)uVar6 - 1;
            uVar6 = (ulong)uVar5;
            pdVar9 = pdVar9 + 1;
            pdVar12 = pdVar12 + 1;
            pdVar10 = pdVar10 + 1;
            pdVar8 = pdVar8 + iVar7;
            pdVar15 = pdVar15 + iVar7;
          } while (uVar5 != 0);
          pdVar9 = pdVar9 + -uVar13;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
LAB_0045eb5a:
        if (local_f8 != (double *)0x0) {
          onfree(local_f8);
        }
        goto LAB_0045e775;
      }
    }
    if (iVar3 != 0) {
      do {
        pdVar15 = pdVar4 + -uVar13;
        uVar6 = uVar13 & 0xffffffff;
        pdVar8 = cv + cv_stride;
        pdVar9 = cv;
        do {
          if (cv_dim != 0) {
            dVar16 = (mult_k - t) / (mult_k - *pdVar15);
            lVar14 = 0;
            lVar11 = 0;
            do {
              pdVar9[lVar11] = pdVar9[lVar11] * dVar16 + pdVar8[lVar11] * (1.0 - dVar16);
              lVar11 = lVar11 + 1;
              lVar14 = lVar14 + -8;
            } while (cv_dim != (int)lVar11);
            pdVar8 = (double *)((long)pdVar8 - lVar14);
            pdVar9 = (double *)((long)pdVar9 - lVar14);
          }
          uVar5 = (int)uVar6 - 1;
          uVar6 = (ulong)uVar5;
          pdVar15 = pdVar15 + 1;
          pdVar9 = pdVar9 + iVar7;
          pdVar8 = pdVar8 + iVar7;
        } while (uVar5 != 0);
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
  }
LAB_0045e775:
  return (bool)(-(dVar1 != dVar2) & 1);
}

Assistant:

bool ON_EvaluateNurbsDeBoor(
                           int cv_dim,
                           int order, 
                           int cv_stride,
                           double *cv,
                           const double *knots, 
                           int side,
                           double mult_k, 
                           double t
                           )
/*
 * Evaluate a B-spline span using the de Boor algorithm
 *
 * INPUT:
 *   cv_dim
 *      >= 1
 *   order
 *      (>= 2)  There is no restriction on order.  For order >= 18,
 *      the necessary workspace is dynamically allocated and deallocated.
 *      (The function requires a workspace of 2*order-2 doubles.)
 *   cv
 *      array of order*cv_dim doubles that specify the B-spline span's
 *      control vertices.
 *   knots
 *      array of 2*(order-1) doubles that specify the B-spline span's
 *      knot vector.
 *   side
 *      -1  return left side of B-spline span in cv array
 *      +1  return right side of B-spline span in cv array
 *      -2  return left side of B-spline span in cv array
 *          Ignore values of knots[0,...,order-3] and assume
 *          left end of span has a fully multiple knot with
 *          value "mult_k".
 *      +2  return right side of B-spline span in cv array
 *          Ignore values of knots[order,...,2*order-2] and
 *          assume right end of span has a fully multiple
 *          knot with value "mult_k".
 *      WARNING: If side is != {-2,-1,+1,+2}, this function may crash
 *               or return garbage.
 *   mult_k
 *      Used when side = -2 or +2.
 *   t 
 *      If side < 0, then the cv's for the portion of the NURB span to
 *      the LEFT of t are computed.  If side > 0, then the cv's for the
 *      portion the span to the RIGHT of t are computed.  The following
 *      table summarizes the restrictions on t:
 *
 *       value of side         condition t must satisfy
 *          -2                    mult_k < t and mult_k < knots[order-1]
 *          -1                    knots[order-2] < t
 *          +1                    t < knots[order-1]
 *          +2                    t < mult_k and knots[order-2] < mult_k
 *
 * OUTPUT:
 *   cv
 *      If side <= 0, the input cv's are replaced with the cv's for
 *      the B-spline span trimmed/extended to [knots[order-2],t]  with
 *      new knot vector {knots[0], ..., knots[order-2], t, ..., t}.
 *                                                      \________/
 *                                                       order-1 t's
 *      In particular, {cv[(order-1)*cv_dim], ..., cv[order*cv_dim - 1]}
 *      is the value of the B-spline at t.
 *      If side > 0, the input cv's are replaced with the cv's for
 *      the B-spline span trimmed/extended to [t,knots[order-1]]  with
 *      new knot vector {t, ..., t, knots[order-1], ..., knots[2*order-3]}.
 *                       \________/
 *                       order-1 t's
 *      In particular, {cv[0], ..., cv[cv_dim-1]} is the value of the B-spline
 *      at t.
 *
 *      NOTE WELL: The input knot vector is NOT modified.  If you want to
 *                 use the returned control points with the input knot vector,
 *                 then it is your responsibility to set
 *                    knots[0] = ... = knots[order-2] = t (side > 0)
 *                 or
 *                    knots[order-1] = ... = knots[2*order-2] = t (side < 0).
 *                 See the comments concering +/- 2 values of the "side"
 *                 argument.  In most cases, you can avoid resetting knots
 *                 by carefully choosing the value of "side" and "mult_k".
 *  TL_EvDeBoor()
 *   true: successful
 *   false: knot[order-2] == knot[order-1]
 *
 * COMMENTS:
 *
 *   This function is the single most important NURB curve function in the
 *   TL library.  It is used to evaluate, trim, split and extend NURB curves.
 *   It is used to convert portions of NURB curves to Beziers and to create
 *   fully multiple end knots.  The functions that perform the above tasks
 *   simply call this function with appropriate values and take linear
 *   combinations of the returned cv's to compute the desired result.
 *
 *   Rational cases are handled adding one to the dimension and applying the
 *   quotient rule as needed.
 *
 *   Set a[i,j] = (t-knots[i+j-1])/(knots[i+j+order-2] - knots[i+j-1])
 *   Set D[i,j] = {cv[j*cv_dim], ..., cv[(j+1)*cv_dim-1]}, if i = 0
 *                (1-a[i,j])*D[i-1,j-1] + a[i,j]*D[i-1,j], if 0 < i <= d = degree
 * 
 *   The collection of D[i,j]'s is typically drawn in a triangular array:
 *
 *   D[0,0]
 *            D[1,1]
 *   D[0,1]              D[2,2]
 *            D[1,2]             ...
 *   D[0,2]
 *  
 *   ...                                  D[d,d]
 *                               ...
 *   D[0,d-1]            D[2,d]
 *            D[1,d]
 *   D[0,d]
 *
 *   When side <= 0, the input cv's are replaced with
 *   D[0,0], D[1,2], ..., D[d,d].
 *
 *   When side >  0, the input cv's are replace with
 *   D[d,d], D[d-1,d], ..., D[0,d].
 *
 * EXAMPLE:
 *
 * REFERENCE:
 *   BOHM-01, Page 16.
 *   LEE-01, Section 6.
 *
 * RELATED FUNCTIONS:
 *   TL_EvNurbBasis(), TL_EvNurb(), TL_EvdeCasteljau(), TL_EvQuotientRule()
 */
{
  double 
    workarray[21], alpha0, alpha1, t0, t1, dt, *delta_t, *free_delta_t, *cv0, *cv1;
  const double 
    *k0, *k1;
  int
    degree, i, j, k;

  const int cv_inc = cv_stride - cv_dim;

  j = 0;
  delta_t = workarray;
  free_delta_t = 0;
  degree = order-1;  
  t0 = knots[degree-1];
  t1 = knots[degree];
  if (t0 == t1) {
    ON_ERROR("ON_EvaluateNurbsDeBoor(): knots[degree-1] == knots[degree]");
    return false;
  }

  if (side < 0) {
    /* if right end of span is fully multiple and t = end knot,
     * then we're done.
     */
    if (t == t1 && t1 == knots[2*degree-1])
      return true;
    /* if left end of span is fully multiple, save time */
    if (side == -2)
      t0 = mult_k;
    else if (t0 == knots[0])
      side = -2;
    else {
      side = -1;
      if (degree > 21)
        delta_t = free_delta_t = (double*)onmalloc(degree*sizeof(*delta_t));
    }
    /* delta_t = {t - knot[order-2], t - knot[order-1], ... , t - knot[0]} */
    knots += degree-1;
    if (side != -2) {
      k0=knots; k=degree; while(k--) *delta_t++ = t - *k0--; delta_t -= degree;
      cv += order*cv_stride;
      k = order; while (--k) { 
        cv1 = cv;
        cv0 = cv1 - cv_stride;
        k0 = knots;             /* *k0 = input_knots[d-1]          */
        k1 = k0+k;              /* *k1 = input_knots[d-1+k]        */ 
        i = k; while(i--) {
          alpha1 = *delta_t++/(*k1-- - *k0--); 
          alpha0 = 1.0 - alpha1;
          cv0 -= cv_inc;
          cv1 -= cv_inc;
          j = cv_dim;
          while (j--) {cv0--; cv1--; *cv1 = *cv0 * alpha0 + *cv1 * alpha1;} 
        }
        delta_t -= k;
      }
    }
    else {
      dt = t - t0;
      // cv += order*cv_dim; // Chuck-n-Dale 21 Sep bug fix change cv_dim to cv_stride
      cv += order*cv_stride;
      k = order; while (--k) { 
        cv1 = cv;
        cv0 = cv1 - cv_stride;
        k1 = knots+k;
        i = k; while(i--) {
          alpha1 = dt/(*k1-- - t0); 
          alpha0 = 1.0 - alpha1;
          cv0 -= cv_inc;
          cv1 -= cv_inc;
          j = cv_dim;
          while (j--) {cv0--; cv1--; *cv1 = *cv0 * alpha0 + *cv1 * alpha1;} 
        }
      }
    }
  }
  else {
    /* if left end of span is fully multiple and t = start knot,
     * then we're done.
     */
    if (t == t0 && t0 == knots[0])
      return true;
    /* if right end of span is fully multiple, save time */
    if (side == 2)
      t1 = mult_k;
    else if (t1 == knots[2*degree-1])
      side = 2;
    else {
      side = 1;
      if (degree > 21)
        delta_t = free_delta_t = (double*)onmalloc(degree*sizeof(*delta_t));
    }
    knots += degree;
    if (side == 1) {
      /* variable right end knots
       * delta_t = {knot[order-1] - t, knot[order] -  t, .. knot[2*order-3] - t}
       */
      k1=knots; k = degree; while (k--) *delta_t++ = *k1++ - t; delta_t -= degree;
      k = order; while (--k) {
        cv0 = cv;
        cv1 = cv0 + cv_stride;
        k1 = knots;
        k0 = k1 - k;
        i = k; while(i--) {
          alpha0 = *delta_t++/(*k1++ - *k0++);
          alpha1 = 1.0 - alpha0;
          j = cv_dim;
          while(j--) {*cv0 = *cv0 * alpha0 + *cv1 * alpha1; cv0++; cv1++;}
          cv0 += cv_inc;
          cv1 += cv_inc;
        }
        delta_t -= k;
      }
    }
    else {
      /* all right end knots = t1  delta_t = t1 - t */
      dt = t1 - t;
      k = order; while (--k) {
        cv0 = cv;
        cv1 = cv0 + cv_stride;
        k0 = knots - k;         /* *knots = input_knots[d]       */ 
        i = k; while(i--) {
          alpha0 = dt/(t1 - *k0++);
          alpha1 = 1.0 - alpha0;
          j = cv_dim;
          while(j--) {*cv0 = *cv0 * alpha0 + *cv1 * alpha1; cv0++; cv1++;}
          cv0 += cv_inc;
          cv1 += cv_inc;
        }
      }
    }
  }
    
  if (free_delta_t)
    onfree(free_delta_t);

  return true;
}